

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMatTransientSingleSpace.h
# Opt level: O0

void __thiscall
TPZMatTransientSingleSpace<TPZLagrangeMultiplier<double>>::ContributeInterface
          (TPZMatTransientSingleSpace<TPZLagrangeMultiplier<double>> *this)

{
  TPZFMatrix<double> *in_stack_00000010;
  TPZFMatrix<double> *in_stack_00000018;
  REAL in_stack_00000020;
  TPZMaterialDataT<double> *in_stack_00000028;
  TPZMaterialDataT<double> *in_stack_00000030;
  TPZMaterialDataT<double> *in_stack_00000038;
  TPZMatTransientSingleSpace<TPZLagrangeMultiplier<double>_> *in_stack_00000040;
  
  TPZMatTransientSingleSpace<TPZLagrangeMultiplier<double>_>::ContributeInterface
            (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028,
             in_stack_00000020,in_stack_00000018,in_stack_00000010);
  return;
}

Assistant:

void TPZMatTransientSingleSpace< TBASEMAT >::ContributeInterface(
    const TPZMaterialDataT<STATE> &data,
    const TPZMaterialDataT<STATE> &dataleft,
    const TPZMaterialDataT<STATE> &dataright,
    REAL weight,
    TPZFMatrix<STATE> &ek,
    TPZFMatrix<STATE> &ef)
{
	
	// Mostly for implicit
	if (this->fStep == ECurrent){
		TBASEMAT::ContributeInterface(data,dataleft,dataright, weight, ek, ef);
		return;
	}
	
	if (this->fStep == ELast){
		return;
	}
	
	// Mostly for explicit
	if (this->fStep == EMassMatrix){
		return;
	}
	if (this->fStep == EFluxOnly){ //Calcula ef = F-ku
		TBASEMAT::ContributeInterface(data,dataleft,dataright, weight, ek, ef);
		return;
	}
	
	
	PZError << "ERROR! " << __PRETTY_FUNCTION__ << " at LINE " << __LINE__ << std::endl;
	
}